

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_DeriveKey
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey)

{
  CK_MECHANISM_TYPE CVar1;
  OSObject *pOVar2;
  bool bVar3;
  int iVar4;
  Session *this_00;
  Token *pTVar5;
  CK_STATE CVar6;
  CK_RV CVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar9;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *local_78;
  CK_KEY_TYPE local_70;
  CK_ULONG local_68;
  CK_OBJECT_HANDLE local_60;
  ulong local_58;
  ulong local_50;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_CERTIFICATE_TYPE dummy;
  undefined4 extraout_var;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (phKey == (CK_OBJECT_HANDLE_PTR)0x0 ||
      (pTemplate == (CK_ATTRIBUTE_PTR)0x0 || pMechanism == (CK_MECHANISM_PTR)0x0)) {
    return 7;
  }
  local_68 = ulCount;
  local_60 = hBaseKey;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  CVar1 = pMechanism->mechanism;
  if ((CVar1 - 0x1100 < 6) ||
     ((((CVar1 - 0x360 < 4 && (CVar1 - 0x360 != 1)) || (CVar1 == 0x21)) || (CVar1 == 0x1050)))) {
    pTVar5 = Session::getToken(this_00);
    if (pTVar5 == (Token *)0x0) {
      return 5;
    }
    local_78 = (OSObject *)HandleManager::getObject(this->handleManager,local_60);
    if (local_78 == (OSObject *)0x0) {
      return 0x82;
    }
    iVar4 = (*local_78->_vptr_OSObject[10])(local_78);
    pOVar2 = local_78;
    if ((char)iVar4 == '\0') {
      return 0x82;
    }
    iVar4 = (*local_78->_vptr_OSObject[4])(local_78,1,0);
    local_70 = CONCAT71(local_70._1_7_,(char)iVar4);
    iVar4 = (*pOVar2->_vptr_OSObject[4])(pOVar2,2,1);
    CVar6 = Session::getState(this_00);
    CVar7 = haveRead(CVar6,(CK_BBOOL)local_70,(CK_BBOOL)iVar4);
    if (CVar7 != 0) {
      if (CVar7 != 0x101) {
        return CVar7;
      }
      iVar4 = 0x1c7f;
LAB_00143688:
      softHSMLog(6,"C_DeriveKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar4,"User is not authorized");
      return 0x101;
    }
    iVar4 = (*local_78->_vptr_OSObject[4])(local_78,0x10c,0);
    if ((char)iVar4 == '\0') {
      return 0x68;
    }
    bVar3 = isMechanismPermitted(this,local_78,pMechanism);
    if (bVar3) {
      isOnToken = '\0';
      isPrivate = '\x01';
      bVar3 = false;
      uVar9 = pMechanism->mechanism - 0x360;
      if ((uVar9 < 4) && (bVar3 = false, uVar9 != 1)) {
        objClass = 4;
        keyType = 0x10;
        bVar3 = true;
      }
      CVar7 = extractObjectInformation
                        (pTemplate,local_68,&objClass,&keyType,&dummy,&isOnToken,&isPrivate,bVar3);
      if (CVar7 != 0) {
        softHSMLog(3,"C_DeriveKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1c9d,"Mandatory attribute not present in template");
        return CVar7;
      }
      if (objClass != 4) {
        return 0x13;
      }
      if (0x1f < keyType) {
        return 0xd1;
      }
      local_70 = keyType;
      if ((0x80390000UL >> (keyType & 0x3f) & 1) == 0) {
        return 0xd1;
      }
      CVar6 = Session::getState(this_00);
      local_50 = (ulong)isOnToken;
      uVar9 = (ulong)isPrivate;
      CVar7 = haveWrite(CVar6,isOnToken,isPrivate);
      pOVar2 = local_78;
      if (CVar7 != 0) {
        if (CVar7 == 0xb5) {
          softHSMLog(6,"C_DeriveKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x1cb2,"Session is read-only");
          return 0xb5;
        }
        if (CVar7 != 0x101) {
          return CVar7;
        }
        iVar4 = 0x1cb0;
        goto LAB_00143688;
      }
      CVar1 = pMechanism->mechanism;
      local_58 = uVar9;
      if ((CVar1 - 0x1100 < 6) || ((CVar1 - 0x360 < 4 && (CVar1 - 0x360 != 1)))) {
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0x100,0x80000000);
        lVar8 = CONCAT44(extraout_var,iVar4);
        iVar4 = (*pOVar2->_vptr_OSObject[5])(pOVar2,0,0x80000000);
        if (CONCAT44(extraout_var_00,iVar4) != 4) {
          return 99;
        }
        uVar9 = pMechanism->mechanism & 0xfffffffffffffffe;
        if (lVar8 != 0x13 && uVar9 == 0x1100) {
          return 99;
        }
        if (lVar8 - 0x16U < 0xfffffffffffffffe && uVar9 == 0x1102) {
          return 99;
        }
        if (lVar8 != 0x1f && uVar9 == 0x1104) {
          return 99;
        }
        CVar7 = deriveSymmetric(this,hSession,pMechanism,local_60,pTemplate,local_68,phKey,local_70,
                                (CK_BBOOL)local_50,(CK_BBOOL)local_58);
        return CVar7;
      }
      if (CVar1 == 0x1050) {
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0,0x80000000);
        if (CONCAT44(extraout_var_03,iVar4) != 3) {
          return 99;
        }
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0x100,0x80000000);
        if (CONCAT44(extraout_var_04,iVar4) == 3) {
          CVar7 = deriveECDH(this,hSession,pMechanism,local_60,pTemplate,local_68,phKey,local_70,
                             (CK_BBOOL)local_50,(CK_BBOOL)local_58);
          return CVar7;
        }
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0x100,0x80000000);
        if (CONCAT44(extraout_var_05,iVar4) != 0x40) {
          return 99;
        }
        CVar7 = deriveEDDSA(this,hSession,pMechanism,local_60,pTemplate,local_68,phKey,local_70,
                            (CK_BBOOL)local_50,(CK_BBOOL)local_58);
        return CVar7;
      }
      if (CVar1 == 0x21) {
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0,0x80000000);
        if (CONCAT44(extraout_var_01,iVar4) != 3) {
          return 99;
        }
        iVar4 = (*local_78->_vptr_OSObject[5])(local_78,0x100,0x80000000);
        if (CONCAT44(extraout_var_02,iVar4) != 2) {
          return 99;
        }
        CVar7 = deriveDH(this,hSession,pMechanism,local_60,pTemplate,local_68,phKey,local_70,
                         (CK_BBOOL)local_50,(CK_BBOOL)local_58);
        return CVar7;
      }
    }
  }
  else {
    softHSMLog(3,"C_DeriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1c6b,"Invalid mechanism");
  }
  return 0x70;
}

Assistant:

CK_RV SoftHSM::C_DeriveKey
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check the mechanism, only accept DH and ECDH derive
	switch (pMechanism->mechanism)
	{
		case CKM_DH_PKCS_DERIVE:
#if defined(WITH_ECC) || defined(WITH_EDDSA)
		case CKM_ECDH1_DERIVE:
#endif
#ifndef WITH_FIPS
		case CKM_DES_ECB_ENCRYPT_DATA:
		case CKM_DES_CBC_ENCRYPT_DATA:
#endif
		case CKM_DES3_ECB_ENCRYPT_DATA:
		case CKM_DES3_CBC_ENCRYPT_DATA:
		case CKM_AES_ECB_ENCRYPT_DATA:
		case CKM_AES_CBC_ENCRYPT_DATA:
		case CKM_CONCATENATE_DATA_AND_BASE:
		case CKM_CONCATENATE_BASE_AND_DATA:
		case CKM_CONCATENATE_BASE_AND_KEY:
			break;

		default:
			ERROR_MSG("Invalid mechanism");
			return CKR_MECHANISM_INVALID;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hBaseKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isKeyOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveRead(session->getState(), isKeyOnToken, isKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for derive
	if (!key->getBooleanValue(CKA_DERIVE, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass;
	CK_KEY_TYPE keyType;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	CK_CERTIFICATE_TYPE dummy;
    bool isImplicit = pMechanism->mechanism == CKM_CONCATENATE_DATA_AND_BASE ||
			pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_DATA ||
			pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_KEY;
    if (isImplicit) {
        // PKCS#11 2.40 section 2.31.5: if no key type is provided then the key produced by this mechanism will
        // be a generic secret key
        objClass = CKO_SECRET_KEY;
        keyType = CKK_GENERIC_SECRET;
    }
    rv = extractObjectInformation(pTemplate, ulCount, objClass, keyType, dummy, isOnToken, isPrivate, isImplicit);
    if (rv != CKR_OK) {
        ERROR_MSG("Mandatory attribute not present in template");
        return rv;
    }

	// Report errors and/or unexpected usage.
	if (objClass != CKO_SECRET_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (keyType != CKK_GENERIC_SECRET &&
	    keyType != CKK_DES &&
	    keyType != CKK_DES2 &&
	    keyType != CKK_DES3 &&
	    keyType != CKK_AES)
		return CKR_TEMPLATE_INCONSISTENT;

	// Check authorization
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Derive DH secret
	if (pMechanism->mechanism == CKM_DH_PKCS_DERIVE)
	{
		// Check key class and type
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DH)
			return CKR_KEY_TYPE_INCONSISTENT;

		return this->deriveDH(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
	}

#if defined(WITH_ECC) || defined(WITH_EDDSA)
	// Derive ECDH secret
	if (pMechanism->mechanism == CKM_ECDH1_DERIVE)
	{
		// Check key class and type
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
#ifdef WITH_ECC
		else if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) == CKK_EC)
			return this->deriveECDH(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
#endif
#ifdef WITH_EDDSA
		else if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) == CKK_EC_EDWARDS)
			return this->deriveEDDSA(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
#endif
		else
			return CKR_KEY_TYPE_INCONSISTENT;
	}
#endif

	// Derive symmetric secret
	if (pMechanism->mechanism == CKM_DES_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES3_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES3_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_AES_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_AES_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_CONCATENATE_DATA_AND_BASE ||
	    pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_DATA ||
	    pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_KEY)
	{
		// Check key class and type
		CK_KEY_TYPE baseKeyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_SECRET_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES3_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES2 && baseKeyType != CKK_DES3)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES3_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES2 && baseKeyType != CKK_DES3)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_AES_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_AES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_AES_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_AES)
			return CKR_KEY_TYPE_INCONSISTENT;

		return this->deriveSymmetric(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
	}

	return CKR_MECHANISM_INVALID;
}